

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::PIQBase::VerifyGetProgramResourceName
          (PIQBase *this,GLuint program,GLenum programInterface,GLuint index,string *expected,
          long *error)

{
  int iVar1;
  GLsizei len;
  GLchar name [1024];
  int local_444;
  long *local_440;
  GLchar local_438 [1032];
  
  local_440 = error;
  memset(local_438,0,0x400);
  glu::CallLogWrapper::glGetProgramResourceName
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
             programInterface,index,0x400,&local_444,local_438);
  if ((local_444 - 0x400U < 0xfffffc01) || (local_438[local_444 - 1] == '\0')) {
    anon_unknown_0::Output
              ("ERROR: Length in glGetProgramResourceName should not count null terminator!\n");
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)expected);
    if ((iVar1 == 0) && (local_438[local_444] == '\0')) {
      return;
    }
    anon_unknown_0::Output("ERROR: Got %s, expected %s\n",local_438,(expected->_M_dataplus)._M_p);
  }
  *local_440 = -1;
  return;
}

Assistant:

virtual inline void VerifyGetProgramResourceName(GLuint program, GLenum programInterface, GLuint index,
													 const std::string& expected, long& error)
	{
		GLchar  name[1024] = { '\0' };
		GLsizei len;
		glGetProgramResourceName(program, programInterface, index, 1024, &len, name);
		if (len <= 0 || len > 1023 || name[len - 1] == '\0')
		{
			Output("ERROR: Length in glGetProgramResourceName should not count null terminator!\n");
			error = ERROR;
		}
		else if (name != expected || name[len] != '\0')
		{
			Output("ERROR: Got %s, expected %s\n", name, expected.c_str());
			error = ERROR;
		}
	}